

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O0

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix4<4l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_4L> out)

{
  reference peVar1;
  reference peVar2;
  complex<float> cVar3;
  complex<float> cVar4;
  _ComplexT extraout_XMM0_Qa;
  _ComplexT extraout_XMM0_Qa_00;
  _ComplexT extraout_XMM0_Qa_01;
  _ComplexT extraout_XMM0_Qa_02;
  int local_2c;
  int i;
  int_t s;
  int_t m;
  fft<float,_2048L,_(re::fft::direction)1> *this_local;
  span<std::complex<float>,_4L> out_local;
  
  this_local = (fft<float,_2048L,_(re::fft::direction)1> *)out.storage_.data_;
  for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
    if (0 < local_2c) {
      gsl::span<std::complex<float>,_4L>::operator[]
                ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 1);
      cVar3._M_value = (long)(local_2c * 2) << 9;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                         ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 1);
      peVar1->_M_value = extraout_XMM0_Qa;
      gsl::span<std::complex<float>,_4L>::operator[]
                ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 2);
      cVar3._M_value = (long)local_2c << 9;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                         ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 2);
      peVar1->_M_value = extraout_XMM0_Qa_00;
      gsl::span<std::complex<float>,_4L>::operator[]
                ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
      cVar3._M_value = (long)(local_2c * 3) << 9;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                         ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
      peVar1->_M_value = extraout_XMM0_Qa_01;
    }
    peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c);
    peVar2 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 1);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 2);
    peVar2 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c);
    peVar2 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 2);
    scissors<float>(peVar1,peVar2);
    cVar4._M_value = (_ComplexT)&this_local;
    gsl::span<std::complex<float>,_4L>::operator[]
              ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
    flip<(re::fft::direction)1,float>(cVar4);
    peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
    peVar1->_M_value = extraout_XMM0_Qa_02;
    peVar1 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 1);
    peVar2 = gsl::span<std::complex<float>,_4L>::operator[]
                       ((span<std::complex<float>,_4L> *)&this_local,(long)local_2c + 3);
    scissors<float>(peVar1,peVar2);
  }
  return;
}

Assistant:

inline void
    butterfly_radix4(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 0; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[2*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[1*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[3*i*s]);
            }
            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 0*m], out[i + 2*m]);
            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
        }
    }